

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O2

int __thiscall FIX::DateTime::getFraction(DateTime *this,int precision)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uStack_8;
  
  switch(precision) {
  case 0:
    goto switchD_001880a5_caseD_0;
  case 1:
    uVar2 = (ulong)this->m_time % 1000000000;
    uStack_8 = 100000000;
    break;
  case 2:
    uVar2 = (ulong)this->m_time % 1000000000;
    uStack_8 = 10000000;
    break;
  case 3:
    uVar2 = (ulong)this->m_time % 1000000000;
    uStack_8 = 1000000;
    break;
  case 4:
    uVar2 = (ulong)this->m_time % 1000000000;
    uStack_8 = 100000;
    break;
  case 5:
    uVar2 = (ulong)this->m_time % 1000000000;
    uStack_8 = 10000;
    break;
  case 6:
    uVar2 = (ulong)this->m_time % 1000000000;
    uStack_8 = 1000;
    break;
  case 7:
    uVar2 = this->m_time;
    uStack_8 = 100;
    goto LAB_00188165;
  case 8:
    uVar2 = this->m_time;
    uStack_8 = 10;
LAB_00188165:
    uVar2 = uVar2 % 1000000000;
    break;
  default:
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->m_time;
    return SUB164(auVar1 % ZEXT816(1000000000),0);
  }
  precision = (int)(uVar2 / uStack_8);
switchD_001880a5_caseD_0:
  return precision;
}

Assistant:

inline int getFraction(int precision) const {
    switch (precision) {
    case 0:
      return (getNanosecond() / PRECISION_FACTOR[0]);

    case 1:
      return (getNanosecond() / PRECISION_FACTOR[1]);

    case 2:
      return (getNanosecond() / PRECISION_FACTOR[2]);

    case 3:
      return (getNanosecond() / PRECISION_FACTOR[3]);

    case 4:
      return (getNanosecond() / PRECISION_FACTOR[4]);

    case 5:
      return (getNanosecond() / PRECISION_FACTOR[5]);

    case 6:
      return (getNanosecond() / PRECISION_FACTOR[6]);

    case 7:
      return (getNanosecond() / PRECISION_FACTOR[7]);

    case 8:
      return (getNanosecond() / PRECISION_FACTOR[8]);

    case 9:
    default:
      return (getNanosecond() / PRECISION_FACTOR[9]);
    }
  }